

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_tests.cpp
# Opt level: O0

void __thiscall mempool_tests::MempoolRemoveTest::test_method(MempoolRemoveTest *this)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  unsigned_long uVar4;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffec28;
  lazy_ostream *in_stack_ffffffffffffec30;
  char *in_stack_ffffffffffffec38;
  size_type in_stack_ffffffffffffec40;
  undefined4 in_stack_ffffffffffffec48;
  undefined1 fTry;
  int in_stack_ffffffffffffec4c;
  const_string *in_stack_ffffffffffffec50;
  undefined4 in_stack_ffffffffffffec58;
  opcodetype in_stack_ffffffffffffec5c;
  CTxMemPoolEntry *in_stack_ffffffffffffec60;
  CTxMemPool *in_stack_ffffffffffffec68;
  CMutableTransaction *local_1370;
  CMutableTransaction *local_1358;
  MemPoolRemovalReason in_stack_ffffffffffffecd4;
  CTransaction *in_stack_ffffffffffffecd8;
  CTxMemPool *in_stack_ffffffffffffece0;
  CMutableTransaction *local_1118;
  CMutableTransaction *local_10b0;
  int i_4;
  int i_3;
  CTxMemPool *testPool;
  int i_2;
  int i_1;
  int i;
  MempoolRemoveTest *this_local;
  lazy_ostream local_102c;
  undefined1 local_1010 [16];
  undefined8 local_1000;
  lazy_ostream local_fcc;
  undefined1 local_fb0 [68];
  lazy_ostream local_f6c;
  undefined1 local_f50 [68];
  lazy_ostream local_f0c;
  undefined1 local_ef0 [64];
  unsigned_long local_eb0;
  undefined1 local_ea8 [16];
  undefined1 local_e98 [64];
  unsigned_long local_e58;
  undefined1 local_e50 [16];
  undefined1 local_e40 [68];
  lazy_ostream local_dfc;
  undefined1 local_de0 [68];
  lazy_ostream local_d9c;
  undefined1 local_d80 [64];
  unsigned_long local_d40;
  undefined1 local_d38 [16];
  undefined1 local_d28 [68];
  uint poolSize;
  CMutableTransaction txParent;
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  CMutableTransaction txGrandChild [3];
  CMutableTransaction CStack_160;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  CMutableTransaction txChild [3];
  CMutableTransaction CStack_50;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffec28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48),in_stack_ffffffffffffec40
            );
  local_18 = 0;
  uStack_10 = 0;
  CStack_50.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  CStack_50.version = 0;
  CStack_50.nLockTime = 0;
  CScript::CScript((CScript *)in_stack_ffffffffffffec28);
  CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
             (size_type)in_stack_ffffffffffffec30);
  CScript::operator=((CScript *)in_stack_ffffffffffffec38,(CScript *)in_stack_ffffffffffffec30);
  CScript::~CScript((CScript *)in_stack_ffffffffffffec28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48),in_stack_ffffffffffffec40
            );
  for (i = 0; i < 3; i = i + 1) {
    CStack_50.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    CStack_50.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CStack_50.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    CStack_50.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    CScript::CScript((CScript *)in_stack_ffffffffffffec28);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffec38,
               (size_type)in_stack_ffffffffffffec30);
    CScript::operator=((CScript *)in_stack_ffffffffffffec38,(CScript *)in_stack_ffffffffffffec30);
    CScript::~CScript((CScript *)in_stack_ffffffffffffec28);
    pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    pvVar2->nValue = 33000;
  }
  local_10b0 = txChild;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffec28);
    local_10b0 = local_10b0 + 1;
  } while (local_10b0 != &CStack_50);
  for (i_1 = 0; i_1 < 3; i_1 = i_1 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48),
               in_stack_ffffffffffffec40);
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    CScript::CScript((CScript *)in_stack_ffffffffffffec28);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
               (size_type)in_stack_ffffffffffffec30);
    CScript::operator=((CScript *)in_stack_ffffffffffffec38,(CScript *)in_stack_ffffffffffffec30);
    CScript::~CScript((CScript *)in_stack_ffffffffffffec28);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48))
    ;
    pvVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    *(undefined8 *)((pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_128;
    *(undefined8 *)((pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uStack_120;
    *(pointer *)(pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         CStack_160.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    *(undefined8 *)((pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         CStack_160._48_8_;
    pvVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    (pvVar3->prevout).n = i_1;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48),
               in_stack_ffffffffffffec40);
    CStack_160.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    CStack_160.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CStack_160.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    CStack_160.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    CScript::CScript((CScript *)in_stack_ffffffffffffec28);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffec38,
               (size_type)in_stack_ffffffffffffec30);
    CScript::operator=((CScript *)in_stack_ffffffffffffec38,(CScript *)in_stack_ffffffffffffec30);
    CScript::~CScript((CScript *)in_stack_ffffffffffffec28);
    pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    pvVar2->nValue = 11000;
  }
  local_1118 = txGrandChild;
  do {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffec28);
    local_1118 = local_1118 + 1;
  } while (local_1118 != &CStack_160);
  for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48),
               in_stack_ffffffffffffec40);
    CScript::CScript((CScript *)in_stack_ffffffffffffec28);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
               (size_type)in_stack_ffffffffffffec30);
    CScript::operator=((CScript *)in_stack_ffffffffffffec38,(CScript *)in_stack_ffffffffffffec30);
    CScript::~CScript((CScript *)in_stack_ffffffffffffec28);
    CMutableTransaction::GetHash
              ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48))
    ;
    pvVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    *(undefined8 *)((pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_238;
    *(undefined8 *)((pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
         uStack_230;
    *(undefined8 *)(pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         local_248;
    *(undefined8 *)((pvVar3->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
         uStack_240;
    pvVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                       ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    (pvVar3->prevout).n = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48),
               in_stack_ffffffffffffec40);
    CScript::CScript((CScript *)in_stack_ffffffffffffec28);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    CScript::operator<<((CScript *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffec38,
               (size_type)in_stack_ffffffffffffec30);
    CScript::operator=((CScript *)in_stack_ffffffffffffec38,(CScript *)in_stack_ffffffffffffec30);
    CScript::~CScript((CScript *)in_stack_ffffffffffffec28);
    pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                       ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffec38,
                        (size_type)in_stack_ffffffffffffec30);
    pvVar2->nValue = 11000;
  }
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffec68,
             (char *)in_stack_ffffffffffffec60,in_stack_ffffffffffffec5c,
             (char *)in_stack_ffffffffffffec50,
             (char *)CONCAT44(in_stack_ffffffffffffec4c,in_stack_ffffffffffffec48));
  fTry = (undefined1)((uint)in_stack_ffffffffffffec48 >> 0x18);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffec38);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffec28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffec68,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffec60,
             (char *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,in_stack_ffffffffffffec4c,(bool)fTry);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffec28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffec68,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffec60,
             (char *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,in_stack_ffffffffffffec4c,(bool)fTry);
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_d40 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    in_stack_ffffffffffffec38 = "poolSize";
    in_stack_ffffffffffffec30 = (lazy_ostream *)&poolSize;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_d28,local_d38,0x48,1,2,&local_d40);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec60,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58));
  CTxMemPool::addUnchecked(in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec28);
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_d9c._4_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    local_d9c._vptr_lazy_ostream._0_4_ = poolSize - 1;
    in_stack_ffffffffffffec38 = "poolSize - 1";
    in_stack_ffffffffffffec30 = &local_d9c;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_d80,&local_d9c.field_0xc,0x4e,1,2,
               (undefined1 *)((long)&local_d9c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec60,
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58));
  CTxMemPool::addUnchecked(in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec28);
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec60,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58))
    ;
    CTxMemPool::addUnchecked(in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec28);
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec60,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58))
    ;
    CTxMemPool::addUnchecked(in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec28);
  }
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_dfc._4_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    local_dfc._vptr_lazy_ostream._0_4_ = poolSize - 2;
    in_stack_ffffffffffffec38 = "poolSize - 2";
    in_stack_ffffffffffffec30 = &local_dfc;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_de0,&local_dfc.field_0xc,0x5a,1,2,
               (undefined1 *)((long)&local_dfc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_e58 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    in_stack_ffffffffffffec38 = "poolSize";
    in_stack_ffffffffffffec30 = (lazy_ostream *)&poolSize;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_e40,local_e50,0x5e,1,2,&local_e58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_eb0 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    in_stack_ffffffffffffec38 = "poolSize";
    in_stack_ffffffffffffec30 = (lazy_ostream *)&poolSize;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_e98,local_ea8,0x61,1,2,&local_eb0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_f0c._4_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    local_f0c._vptr_lazy_ostream._0_4_ = poolSize - 5;
    in_stack_ffffffffffffec38 = "poolSize - 5";
    in_stack_ffffffffffffec30 = &local_f0c;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_ef0,&local_f0c.field_0xc,0x65,1,2,
               (undefined1 *)((long)&local_f0c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_f6c._4_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    local_f6c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffec38 = "0U";
    in_stack_ffffffffffffec30 = &local_f6c;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_f50,&local_f6c.field_0xc,0x66,1,2,
               (undefined1 *)((long)&local_f6c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec60,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58))
    ;
    CTxMemPool::addUnchecked(in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec28);
    TestMemPoolEntryHelper::FromTx
              ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec60,
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58))
    ;
    CTxMemPool::addUnchecked(in_stack_ffffffffffffec68,in_stack_ffffffffffffec60);
    CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec28);
  }
  uVar4 = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
  poolSize = (uint)uVar4;
  CTransaction::CTransaction
            ((CTransaction *)in_stack_ffffffffffffec68,
             (CMutableTransaction *)in_stack_ffffffffffffec60);
  CTxMemPool::removeRecursive
            (in_stack_ffffffffffffece0,in_stack_ffffffffffffecd8,in_stack_ffffffffffffecd4);
  CTransaction::~CTransaction((CTransaction *)in_stack_ffffffffffffec28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_fcc._4_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    local_fcc._vptr_lazy_ostream._0_4_ = poolSize - 6;
    in_stack_ffffffffffffec38 = "poolSize - 6";
    in_stack_ffffffffffffec30 = &local_fcc;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_fb0,&local_fcc.field_0xc,0x72,1,2,
               (undefined1 *)((long)&local_fcc._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec68,
               (const_string *)in_stack_ffffffffffffec60,
               CONCAT44(in_stack_ffffffffffffec5c,in_stack_ffffffffffffec58),
               in_stack_ffffffffffffec50);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffec30,(char (*) [1])in_stack_ffffffffffffec28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec38,
               (pointer)in_stack_ffffffffffffec30,(unsigned_long)in_stack_ffffffffffffec28);
    local_102c._4_8_ = CTxMemPool::size((CTxMemPool *)in_stack_ffffffffffffec38);
    local_102c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffec38 = "0U";
    in_stack_ffffffffffffec30 = &local_102c;
    in_stack_ffffffffffffec28 = "testPool.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_1010,&local_102c.field_0xc,0x73,1,2,
               (undefined1 *)((long)&local_102c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffec28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffec28);
  local_1358 = &CStack_160;
  do {
    local_1358 = local_1358 + -1;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffec28);
  } while (local_1358 != txGrandChild);
  local_1370 = &CStack_50;
  do {
    local_1370 = local_1370 + -1;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffec28);
  } while (local_1370 != txChild);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffec28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(MempoolRemoveTest)
{
    // Test CTxMemPool::remove functionality

    TestMemPoolEntryHelper entry;
    // Parent transaction with three children,
    // and three grand-children:
    CMutableTransaction txParent;
    txParent.vin.resize(1);
    txParent.vin[0].scriptSig = CScript() << OP_11;
    txParent.vout.resize(3);
    for (int i = 0; i < 3; i++)
    {
        txParent.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txParent.vout[i].nValue = 33000LL;
    }
    CMutableTransaction txChild[3];
    for (int i = 0; i < 3; i++)
    {
        txChild[i].vin.resize(1);
        txChild[i].vin[0].scriptSig = CScript() << OP_11;
        txChild[i].vin[0].prevout.hash = txParent.GetHash();
        txChild[i].vin[0].prevout.n = i;
        txChild[i].vout.resize(1);
        txChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txChild[i].vout[0].nValue = 11000LL;
    }
    CMutableTransaction txGrandChild[3];
    for (int i = 0; i < 3; i++)
    {
        txGrandChild[i].vin.resize(1);
        txGrandChild[i].vin[0].scriptSig = CScript() << OP_11;
        txGrandChild[i].vin[0].prevout.hash = txChild[i].GetHash();
        txGrandChild[i].vin[0].prevout.n = 0;
        txGrandChild[i].vout.resize(1);
        txGrandChild[i].vout[0].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        txGrandChild[i].vout[0].nValue = 11000LL;
    }


    CTxMemPool& testPool = *Assert(m_node.mempool);
    LOCK2(::cs_main, testPool.cs);

    // Nothing in pool, remove should do nothing:
    unsigned int poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);

    // Just the parent:
    testPool.addUnchecked(entry.FromTx(txParent));
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 1);

    // Parent, children, grandchildren:
    testPool.addUnchecked(entry.FromTx(txParent));
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Remove Child[0], GrandChild[0] should be removed:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 2);
    // ... make sure grandchild and child are gone:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txGrandChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txChild[0]), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize);
    // Remove parent, all children/grandchildren should go:
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 5);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);

    // Add children and grandchildren, but NOT the parent (simulate the parent being in a block)
    for (int i = 0; i < 3; i++)
    {
        testPool.addUnchecked(entry.FromTx(txChild[i]));
        testPool.addUnchecked(entry.FromTx(txGrandChild[i]));
    }
    // Now remove the parent, as might happen if a block-re-org occurs but the parent cannot be
    // put into the mempool (maybe because it is non-standard):
    poolSize = testPool.size();
    testPool.removeRecursive(CTransaction(txParent), REMOVAL_REASON_DUMMY);
    BOOST_CHECK_EQUAL(testPool.size(), poolSize - 6);
    BOOST_CHECK_EQUAL(testPool.size(), 0U);
}